

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  vfloat<4> vVar2;
  BVH *bvh;
  Ref<embree::Geometry> *pRVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar42;
  int iVar43;
  int iVar44;
  byte bVar45;
  int iVar46;
  AABBNodeMB4D *node1;
  ulong uVar47;
  byte bVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  uint uVar52;
  NodeRef root;
  size_t sVar53;
  ulong uVar54;
  byte bVar55;
  ulong uVar56;
  ulong uVar57;
  uint uVar58;
  vuint<4> *v;
  undefined4 uVar59;
  NodeRef *pNVar60;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar61;
  bool bVar62;
  byte bVar63;
  ulong uVar64;
  ulong uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar98;
  float fVar99;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar100;
  undefined1 auVar97 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  float fVar103;
  vint4 ai_2;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 in_ZMM2 [64];
  vint4 ai;
  undefined1 auVar110 [16];
  float fVar111;
  float fVar114;
  float fVar115;
  vint4 ai_1;
  undefined1 auVar112 [16];
  float fVar116;
  undefined1 auVar113 [16];
  float fVar117;
  float fVar119;
  float fVar120;
  vint4 ai_3;
  undefined1 auVar118 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  vint4 bi;
  float fVar125;
  float fVar126;
  float fVar129;
  float fVar130;
  vint4 bi_1;
  float fVar131;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  vint4 bi_3;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [64];
  vint4 bi_2;
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar138 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar152;
  float fVar153;
  undefined1 auVar151 [16];
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar157 [16];
  undefined1 in_ZMM15 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  Precalculations pre;
  uint local_19d8;
  vuint<4> *v_1;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  Vec3<embree::vfloat_impl<4>_> p0;
  TravRayK<4,_false> tray;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1768;
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1708 [8];
  float fStack_1700;
  float fStack_16fc;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar70 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar76 = ZEXT816(0) << 0x40;
    uVar14 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar76,5);
    uVar64 = vpcmpeqd_avx512vl(auVar70,(undefined1  [16])valid_i->field_0);
    uVar64 = ((byte)uVar14 & 0xf) & uVar64;
    bVar63 = (byte)uVar64;
    if (bVar63 != 0) {
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar67._8_4_ = 0x7fffffff;
      auVar67._0_8_ = 0x7fffffff7fffffff;
      auVar67._12_4_ = 0x7fffffff;
      auVar70 = vandps_avx(auVar67,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar66._8_4_ = 0x219392ef;
      auVar66._0_8_ = 0x219392ef219392ef;
      auVar66._12_4_ = 0x219392ef;
      auVar136 = ZEXT1664(auVar66);
      uVar47 = vcmpps_avx512vl(auVar70,auVar66,1);
      bVar62 = (bool)((byte)uVar47 & 1);
      auVar68._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * tray.dir.field_0._0_4_;
      bVar62 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar68._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * tray.dir.field_0._4_4_;
      bVar62 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar68._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * tray.dir.field_0._8_4_;
      bVar62 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar68._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * tray.dir.field_0._12_4_;
      auVar70 = vandps_avx(auVar67,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      uVar47 = vcmpps_avx512vl(auVar70,auVar66,1);
      bVar62 = (bool)((byte)uVar47 & 1);
      auVar69._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * tray.dir.field_0._16_4_;
      bVar62 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar69._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * tray.dir.field_0._20_4_;
      bVar62 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar69._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * tray.dir.field_0._24_4_;
      bVar62 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar69._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * tray.dir.field_0._28_4_;
      auVar70 = vandps_avx(auVar67,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      uVar47 = vcmpps_avx512vl(auVar70,auVar66,1);
      bVar62 = (bool)((byte)uVar47 & 1);
      auVar70._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * tray.dir.field_0._32_4_;
      bVar62 = (bool)((byte)(uVar47 >> 1) & 1);
      auVar70._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * tray.dir.field_0._36_4_;
      bVar62 = (bool)((byte)(uVar47 >> 2) & 1);
      auVar70._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * tray.dir.field_0._40_4_;
      bVar62 = (bool)((byte)(uVar47 >> 3) & 1);
      auVar70._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * tray.dir.field_0._44_4_;
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar158 = ZEXT1664(auVar66);
      auVar67 = vrcp14ps_avx512vl(auVar68);
      auVar68 = vfnmadd213ps_avx512vl(auVar68,auVar67,auVar66);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar68,auVar67,auVar67)
      ;
      auVar68 = vrcp14ps_avx512vl(auVar69);
      auVar69 = vfnmadd213ps_avx512vl(auVar69,auVar68,auVar66);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar69,auVar68,auVar68)
      ;
      auVar68 = vrcp14ps_avx512vl(auVar70);
      auVar134 = ZEXT1664(auVar68);
      auVar70 = vfnmadd213ps_avx512vl(auVar70,auVar68,auVar66);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar70,auVar68,auVar68)
      ;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      tray.org_rdir.field_0._0_4_ = *(float *)ray * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = *(float *)(ray + 4) * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = *(float *)(ray + 8) * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = *(float *)(ray + 0xc) * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      uVar47 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar76,1);
      auVar70 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar47 & 1) * auVar70._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar47 >> 1) & 1) * auVar70._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar47 >> 2) & 1) * auVar70._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar47 >> 3) & 1) * auVar70._12_4_;
      uVar47 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar76,5);
      auVar70 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar62 = (bool)((byte)uVar47 & 1);
      bVar7 = (bool)((byte)(uVar47 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar47 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar47 >> 3) & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar62 * auVar70._0_4_ | (uint)!bVar62 * 0x30;
      tray.nearXYZ.field_0._20_4_ = (uint)bVar7 * auVar70._4_4_ | (uint)!bVar7 * 0x30;
      tray.nearXYZ.field_0._24_4_ = (uint)bVar8 * auVar70._8_4_ | (uint)!bVar8 * 0x30;
      tray.nearXYZ.field_0._28_4_ = (uint)bVar9 * auVar70._12_4_ | (uint)!bVar9 * 0x30;
      uVar47 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar76,5);
      auVar70 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar62 = (bool)((byte)uVar47 & 1);
      bVar7 = (bool)((byte)(uVar47 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar47 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar47 >> 3) & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar62 * auVar70._0_4_ | (uint)!bVar62 * 0x50;
      tray.nearXYZ.field_0._36_4_ = (uint)bVar7 * auVar70._4_4_ | (uint)!bVar7 * 0x50;
      tray.nearXYZ.field_0._40_4_ = (uint)bVar8 * auVar70._8_4_ | (uint)!bVar8 * 0x50;
      tray.nearXYZ.field_0._44_4_ = (uint)bVar9 * auVar70._12_4_ | (uint)!bVar9 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar159 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar70 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar76);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar63 & 1) * auVar70._0_4_ |
           (uint)!(bool)(bVar63 & 1) * stack_near[0].field_0._0_4_;
      bVar62 = (bool)((byte)(uVar64 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar62 * auVar70._4_4_ | (uint)!bVar62 * stack_near[0].field_0._4_4_;
      bVar62 = (bool)((byte)(uVar64 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar62 * auVar70._8_4_ | (uint)!bVar62 * stack_near[0].field_0._8_4_;
      bVar62 = SUB81(uVar64 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar62 * auVar70._12_4_ | (uint)!bVar62 * stack_near[0].field_0._12_4_;
      auVar70 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar76);
      tray.tfar.field_0.i[0] =
           (uint)(bVar63 & 1) * auVar70._0_4_ | (uint)!(bool)(bVar63 & 1) * -0x800000;
      bVar62 = (bool)((byte)(uVar64 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar62 * auVar70._4_4_ | (uint)!bVar62 * -0x800000;
      bVar62 = (bool)((byte)(uVar64 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar62 * auVar70._8_4_ | (uint)!bVar62 * -0x800000;
      bVar62 = SUB81(uVar64 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar62 * auVar70._12_4_ | (uint)!bVar62 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar58 = 3;
      }
      else {
        uVar58 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      local_19d8 = (byte)((ushort)((short)uVar64 << 0xc) >> 0xc) ^ 0xf;
      pNVar60 = stack_node + 2;
      paVar61 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar70 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar160 = ZEXT1664(auVar70);
      auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar161 = ZEXT1664(auVar70);
LAB_01f3ec6a:
      do {
        do {
          root.ptr = pNVar60[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01f3f973;
          pNVar60 = pNVar60 + -1;
          paVar61 = paVar61 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar61->v;
          auVar102 = ZEXT1664((undefined1  [16])vVar2.field_0);
          uVar64 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar64 == '\0');
        uVar59 = (undefined4)uVar64;
        if (uVar58 < (uint)POPCOUNT(uVar59)) {
LAB_01f3ecac:
          do {
            uVar52 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01f3f973;
              uVar14 = vcmpps_avx512vl(auVar102._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar14 != '\0') {
                uVar64 = (ulong)(uVar52 & 0xf);
                bVar55 = (byte)((ulong)local_19d8 & 0xffffffffffffff0f);
                if (uVar64 != 8) {
                  uVar56 = (ulong)local_19d8 & 0xffffffffffffff0f ^ 0xf;
                  uVar47 = 0;
                  do {
                    lVar49 = uVar47 * 0x50 + (root.ptr & 0xfffffffffffffff0);
                    bVar55 = (byte)uVar56;
                    uVar17 = 0;
                    for (uVar51 = uVar56; (uVar51 & 1) == 0;
                        uVar51 = uVar51 >> 1 | 0x8000000000000000) {
                      uVar17 = uVar17 + 1;
                    }
                    uVar51 = 0;
                    uVar65 = uVar56;
                    while( true ) {
                      auVar155 = in_ZMM14._0_16_;
                      auVar76 = auVar134._0_16_;
                      auVar135 = auVar136._0_16_;
                      bVar45 = (byte)uVar65;
                      auVar157 = in_ZMM15._0_16_;
                      if (*(int *)(lVar49 + 0x40 + uVar51 * 4) == -1) break;
                      pRVar3 = (context->scene->geometries).items;
                      pGVar4 = pRVar3[*(uint *)(lVar49 + 0x30 + uVar51 * 4)].ptr;
                      fVar92 = (pGVar4->time_range).lower;
                      auVar93._4_4_ = fVar92;
                      auVar93._0_4_ = fVar92;
                      auVar93._8_4_ = fVar92;
                      auVar93._12_4_ = fVar92;
                      fVar98 = pGVar4->fnumTimeSegments;
                      auVar104._4_4_ = fVar98;
                      auVar104._0_4_ = fVar98;
                      auVar104._8_4_ = fVar98;
                      auVar104._12_4_ = fVar98;
                      auVar10 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar93);
                      fVar92 = (pGVar4->time_range).upper - fVar92;
                      auVar94._4_4_ = fVar92;
                      auVar94._0_4_ = fVar92;
                      auVar94._8_4_ = fVar92;
                      auVar94._12_4_ = fVar92;
                      auVar70 = vdivps_avx(auVar10,auVar94);
                      auVar95._0_4_ = fVar98 * auVar70._0_4_;
                      auVar95._4_4_ = fVar98 * auVar70._4_4_;
                      auVar95._8_4_ = fVar98 * auVar70._8_4_;
                      auVar95._12_4_ = fVar98 * auVar70._12_4_;
                      auVar70 = vroundps_avx(auVar95,1);
                      auVar68 = vaddss_avx512f(auVar104,SUB6416(ZEXT464(0xbf800000),0));
                      auVar105._0_4_ = auVar68._0_4_;
                      auVar105._4_4_ = auVar105._0_4_;
                      auVar105._8_4_ = auVar105._0_4_;
                      auVar105._12_4_ = auVar105._0_4_;
                      auVar70 = vminps_avx(auVar70,auVar105);
                      auVar69 = auVar160._0_16_;
                      auVar70 = vmaxps_avx512vl(auVar70,auVar69);
                      itime.field_0 =
                           (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar70);
                      auVar70 = vsubps_avx(auVar95,auVar70);
                      auVar75 = vpbroadcastd_avx512vl();
                      uVar14 = vpcmpeqd_avx512vl(auVar75,(undefined1  [16])itime.field_0);
                      auVar68 = auVar158._0_16_;
                      if (((byte)uVar14 & 0xf | ~bVar55 & 0xf) == 0xf) {
                        lVar50 = (long)itime.field_0.i[uVar17] * 0x38;
                        lVar5 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar50);
                        lVar50 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar50);
                        uVar65 = (ulong)*(uint *)(lVar49 + uVar51 * 4);
                        uVar57 = (ulong)*(uint *)(lVar49 + 0x10 + uVar51 * 4);
                        auVar76 = vsubps_avx512vl(auVar68,auVar70);
                        uVar59 = *(undefined4 *)(lVar50 + uVar65 * 4);
                        auVar23._4_4_ = uVar59;
                        auVar23._0_4_ = uVar59;
                        auVar23._8_4_ = uVar59;
                        auVar23._12_4_ = uVar59;
                        auVar66 = vmulps_avx512vl(auVar70,auVar23);
                        uVar59 = *(undefined4 *)(lVar50 + 4 + uVar65 * 4);
                        auVar24._4_4_ = uVar59;
                        auVar24._0_4_ = uVar59;
                        auVar24._8_4_ = uVar59;
                        auVar24._12_4_ = uVar59;
                        auVar67 = vmulps_avx512vl(auVar70,auVar24);
                        uVar59 = *(undefined4 *)(lVar50 + 8 + uVar65 * 4);
                        auVar25._4_4_ = uVar59;
                        auVar25._0_4_ = uVar59;
                        auVar25._8_4_ = uVar59;
                        auVar25._12_4_ = uVar59;
                        auVar71 = vmulps_avx512vl(auVar70,auVar25);
                        uVar59 = *(undefined4 *)(lVar5 + uVar65 * 4);
                        auVar26._4_4_ = uVar59;
                        auVar26._0_4_ = uVar59;
                        auVar26._8_4_ = uVar59;
                        auVar26._12_4_ = uVar59;
                        auVar77 = vfmadd231ps_avx512vl(auVar66,auVar76,auVar26);
                        uVar59 = *(undefined4 *)(lVar5 + 4 + uVar65 * 4);
                        auVar27._4_4_ = uVar59;
                        auVar27._0_4_ = uVar59;
                        auVar27._8_4_ = uVar59;
                        auVar27._12_4_ = uVar59;
                        auVar78 = vfmadd231ps_avx512vl(auVar67,auVar76,auVar27);
                        uVar59 = *(undefined4 *)(lVar5 + 8 + uVar65 * 4);
                        auVar28._4_4_ = uVar59;
                        auVar28._0_4_ = uVar59;
                        auVar28._8_4_ = uVar59;
                        auVar28._12_4_ = uVar59;
                        auVar79 = vfmadd231ps_avx512vl(auVar71,auVar76,auVar28);
                        uVar59 = *(undefined4 *)(lVar50 + uVar57 * 4);
                        auVar29._4_4_ = uVar59;
                        auVar29._0_4_ = uVar59;
                        auVar29._8_4_ = uVar59;
                        auVar29._12_4_ = uVar59;
                        auVar66 = vmulps_avx512vl(auVar70,auVar29);
                        uVar59 = *(undefined4 *)(lVar50 + 4 + uVar57 * 4);
                        auVar30._4_4_ = uVar59;
                        auVar30._0_4_ = uVar59;
                        auVar30._8_4_ = uVar59;
                        auVar30._12_4_ = uVar59;
                        auVar67 = vmulps_avx512vl(auVar70,auVar30);
                        uVar59 = *(undefined4 *)(lVar50 + 8 + uVar57 * 4);
                        auVar31._4_4_ = uVar59;
                        auVar31._0_4_ = uVar59;
                        auVar31._8_4_ = uVar59;
                        auVar31._12_4_ = uVar59;
                        auVar71 = vmulps_avx512vl(auVar70,auVar31);
                        uVar59 = *(undefined4 *)(lVar5 + uVar57 * 4);
                        auVar32._4_4_ = uVar59;
                        auVar32._0_4_ = uVar59;
                        auVar32._8_4_ = uVar59;
                        auVar32._12_4_ = uVar59;
                        auVar80 = vfmadd231ps_avx512vl(auVar66,auVar76,auVar32);
                        uVar59 = *(undefined4 *)(lVar5 + 4 + uVar57 * 4);
                        auVar33._4_4_ = uVar59;
                        auVar33._0_4_ = uVar59;
                        auVar33._8_4_ = uVar59;
                        auVar33._12_4_ = uVar59;
                        auVar81 = vfmadd231ps_avx512vl(auVar67,auVar76,auVar33);
                        uVar59 = *(undefined4 *)(lVar5 + 8 + uVar57 * 4);
                        auVar34._4_4_ = uVar59;
                        auVar34._0_4_ = uVar59;
                        auVar34._8_4_ = uVar59;
                        auVar34._12_4_ = uVar59;
                        auVar82 = vfmadd231ps_avx512vl(auVar71,auVar76,auVar34);
                        uVar65 = (ulong)*(uint *)(lVar49 + 0x20 + uVar51 * 4);
                        uVar59 = *(undefined4 *)(lVar50 + uVar65 * 4);
                        auVar35._4_4_ = uVar59;
                        auVar35._0_4_ = uVar59;
                        auVar35._8_4_ = uVar59;
                        auVar35._12_4_ = uVar59;
                        auVar66 = vmulps_avx512vl(auVar70,auVar35);
                        uVar59 = *(undefined4 *)(lVar50 + 4 + uVar65 * 4);
                        auVar36._4_4_ = uVar59;
                        auVar36._0_4_ = uVar59;
                        auVar36._8_4_ = uVar59;
                        auVar36._12_4_ = uVar59;
                        auVar67 = vmulps_avx512vl(auVar70,auVar36);
                        uVar59 = *(undefined4 *)(lVar50 + 8 + uVar65 * 4);
                        auVar37._4_4_ = uVar59;
                        auVar37._0_4_ = uVar59;
                        auVar37._8_4_ = uVar59;
                        auVar37._12_4_ = uVar59;
                        auVar70 = vmulps_avx512vl(auVar70,auVar37);
                        uVar59 = *(undefined4 *)(lVar5 + uVar65 * 4);
                        auVar38._4_4_ = uVar59;
                        auVar38._0_4_ = uVar59;
                        auVar38._8_4_ = uVar59;
                        auVar38._12_4_ = uVar59;
                        auVar83 = vfmadd231ps_avx512vl(auVar66,auVar76,auVar38);
                        uVar59 = *(undefined4 *)(lVar5 + 4 + uVar65 * 4);
                        auVar39._4_4_ = uVar59;
                        auVar39._0_4_ = uVar59;
                        auVar39._8_4_ = uVar59;
                        auVar39._12_4_ = uVar59;
                        auVar84 = vfmadd231ps_avx512vl(auVar67,auVar76,auVar39);
                        uVar59 = *(undefined4 *)(lVar5 + 8 + uVar65 * 4);
                        auVar40._4_4_ = uVar59;
                        auVar40._0_4_ = uVar59;
                        auVar40._8_4_ = uVar59;
                        auVar40._12_4_ = uVar59;
                        auVar85 = vfmadd231ps_avx512vl(auVar70,auVar76,auVar40);
                      }
                      else {
                        if (bVar55 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar54 = (ulong)*(uint *)(lVar49 + uVar51 * 4);
                          uVar57 = uVar56;
                          uVar65 = uVar17;
                          do {
                            lVar50 = (long)itime.field_0.i[uVar65] * 0x38;
                            auVar66 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar50) + uVar54 * 4)
                            ;
                            auVar67 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + 0x38 + lVar50) + uVar54 * 4);
                            *(int *)((long)&p0.field_0 + uVar65 * 4) = auVar66._0_4_;
                            uVar59 = vextractps_avx(auVar66,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar65 * 4 + 0x10) = uVar59;
                            uVar59 = vextractps_avx(auVar66,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar65 * 4 + 0x20) = uVar59;
                            *(int *)((long)&p1.field_0 + uVar65 * 4) = auVar67._0_4_;
                            uVar59 = vextractps_avx(auVar67,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar65 * 4 + 0x10) = uVar59;
                            uVar59 = vextractps_avx(auVar67,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar65 * 4 + 0x20) = uVar59;
                            uVar57 = uVar57 ^ 1L << (uVar65 & 0x3f);
                            uVar65 = 0;
                            for (uVar18 = uVar57; (uVar18 & 1) == 0;
                                uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                              uVar65 = uVar65 + 1;
                            }
                          } while (uVar57 != 0);
                          auVar10._8_8_ = p0.field_0._8_8_;
                          auVar10._0_8_ = p0.field_0._0_8_;
                          auVar75._8_8_ = p1.field_0._8_8_;
                          auVar75._0_8_ = p1.field_0._0_8_;
                        }
                        auVar66 = vsubps_avx512vl(auVar68,auVar70);
                        fVar103 = auVar66._0_4_;
                        fVar111 = fVar103 * (float)p0.field_0._16_4_;
                        fVar107 = auVar66._4_4_;
                        fVar114 = fVar107 * (float)p0.field_0._20_4_;
                        fVar108 = auVar66._8_4_;
                        fVar115 = fVar108 * (float)p0.field_0._24_4_;
                        fVar109 = auVar66._12_4_;
                        fVar116 = fVar109 * (float)p0.field_0._28_4_;
                        fVar117 = fVar103 * (float)p0.field_0._32_4_;
                        fVar119 = fVar107 * (float)p0.field_0._36_4_;
                        fVar120 = fVar108 * (float)p0.field_0._40_4_;
                        fVar121 = fVar109 * (float)p0.field_0._44_4_;
                        fVar92 = auVar70._0_4_;
                        fVar122 = fVar92 * (float)p1.field_0._16_4_;
                        fVar98 = auVar70._4_4_;
                        fVar123 = fVar98 * (float)p1.field_0._20_4_;
                        fVar99 = auVar70._8_4_;
                        fVar124 = fVar99 * (float)p1.field_0._24_4_;
                        fVar100 = auVar70._12_4_;
                        fVar125 = fVar100 * (float)p1.field_0._28_4_;
                        fVar126 = fVar92 * (float)p1.field_0._32_4_;
                        fVar129 = fVar98 * (float)p1.field_0._36_4_;
                        fVar130 = fVar99 * (float)p1.field_0._40_4_;
                        fVar131 = fVar100 * (float)p1.field_0._44_4_;
                        if (bVar55 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar54 = (ulong)*(uint *)(lVar49 + 0x10 + uVar51 * 4);
                          uVar57 = uVar56;
                          uVar65 = uVar17;
                          do {
                            lVar50 = (long)itime.field_0.i[uVar65] * 0x38;
                            auVar70 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar50) + uVar54 * 4)
                            ;
                            auVar76 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + 0x38 + lVar50) + uVar54 * 4);
                            *(int *)((long)&p0.field_0 + uVar65 * 4) = auVar70._0_4_;
                            uVar59 = vextractps_avx(auVar70,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar65 * 4 + 0x10) = uVar59;
                            uVar59 = vextractps_avx(auVar70,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar65 * 4 + 0x20) = uVar59;
                            *(int *)((long)&p1.field_0 + uVar65 * 4) = auVar76._0_4_;
                            uVar59 = vextractps_avx(auVar76,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar65 * 4 + 0x10) = uVar59;
                            uVar59 = vextractps_avx(auVar76,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar65 * 4 + 0x20) = uVar59;
                            uVar57 = uVar57 ^ 1L << (uVar65 & 0x3f);
                            uVar65 = 0;
                            for (uVar18 = uVar57; (uVar18 & 1) == 0;
                                uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                              uVar65 = uVar65 + 1;
                            }
                          } while (uVar57 != 0);
                          auVar135._8_8_ = p0.field_0._8_8_;
                          auVar135._0_8_ = p0.field_0._0_8_;
                          auVar76._8_8_ = p1.field_0._8_8_;
                          auVar76._0_8_ = p1.field_0._0_8_;
                        }
                        fVar137 = fVar103 * (float)p0.field_0._16_4_;
                        fVar139 = fVar107 * (float)p0.field_0._20_4_;
                        fVar140 = fVar108 * (float)p0.field_0._24_4_;
                        fVar141 = fVar109 * (float)p0.field_0._28_4_;
                        fVar142 = fVar103 * (float)p0.field_0._32_4_;
                        fVar143 = fVar107 * (float)p0.field_0._36_4_;
                        fVar144 = fVar108 * (float)p0.field_0._40_4_;
                        fVar145 = fVar109 * (float)p0.field_0._44_4_;
                        fVar146 = fVar92 * (float)p1.field_0._16_4_;
                        fVar147 = fVar98 * (float)p1.field_0._20_4_;
                        fVar148 = fVar99 * (float)p1.field_0._24_4_;
                        fVar149 = fVar100 * (float)p1.field_0._28_4_;
                        fVar150 = fVar92 * (float)p1.field_0._32_4_;
                        fVar152 = fVar98 * (float)p1.field_0._36_4_;
                        fVar153 = fVar99 * (float)p1.field_0._40_4_;
                        fVar154 = fVar100 * (float)p1.field_0._44_4_;
                        if (bVar55 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar54 = (ulong)*(uint *)(lVar49 + 0x20 + uVar51 * 4);
                          uVar57 = uVar56;
                          uVar65 = uVar17;
                          do {
                            lVar50 = (long)itime.field_0.i[uVar65] * 0x38;
                            auVar70 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar50) + uVar54 * 4)
                            ;
                            auVar66 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + 0x38 + lVar50) + uVar54 * 4);
                            *(int *)((long)&p0.field_0 + uVar65 * 4) = auVar70._0_4_;
                            uVar59 = vextractps_avx(auVar70,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar65 * 4 + 0x10) = uVar59;
                            uVar59 = vextractps_avx(auVar70,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar65 * 4 + 0x20) = uVar59;
                            *(int *)((long)&p1.field_0 + uVar65 * 4) = auVar66._0_4_;
                            uVar59 = vextractps_avx(auVar66,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar65 * 4 + 0x10) = uVar59;
                            uVar59 = vextractps_avx(auVar66,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar65 * 4 + 0x20) = uVar59;
                            uVar57 = uVar57 ^ 1L << (uVar65 & 0x3f);
                            uVar65 = 0;
                            for (uVar18 = uVar57; (uVar18 & 1) == 0;
                                uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                              uVar65 = uVar65 + 1;
                            }
                          } while (uVar57 != 0);
                          auVar157._8_8_ = p0.field_0._8_8_;
                          auVar157._0_8_ = p0.field_0._0_8_;
                          auVar155._8_8_ = p1.field_0._8_8_;
                          auVar155._0_8_ = p1.field_0._0_8_;
                        }
                        auVar77._0_4_ = fVar103 * auVar10._0_4_ + fVar92 * auVar75._0_4_;
                        auVar77._4_4_ = fVar107 * auVar10._4_4_ + fVar98 * auVar75._4_4_;
                        auVar77._8_4_ = fVar108 * auVar10._8_4_ + fVar99 * auVar75._8_4_;
                        auVar77._12_4_ = fVar109 * auVar10._12_4_ + fVar100 * auVar75._12_4_;
                        auVar78._0_4_ = fVar111 + fVar122;
                        auVar78._4_4_ = fVar114 + fVar123;
                        auVar78._8_4_ = fVar115 + fVar124;
                        auVar78._12_4_ = fVar116 + fVar125;
                        auVar79._0_4_ = fVar117 + fVar126;
                        auVar79._4_4_ = fVar119 + fVar129;
                        auVar79._8_4_ = fVar120 + fVar130;
                        auVar79._12_4_ = fVar121 + fVar131;
                        auVar80._0_4_ = auVar135._0_4_ * fVar103 + auVar76._0_4_ * fVar92;
                        auVar80._4_4_ = auVar135._4_4_ * fVar107 + auVar76._4_4_ * fVar98;
                        auVar80._8_4_ = auVar135._8_4_ * fVar108 + auVar76._8_4_ * fVar99;
                        auVar80._12_4_ = auVar135._12_4_ * fVar109 + auVar76._12_4_ * fVar100;
                        auVar81._0_4_ = fVar137 + fVar146;
                        auVar81._4_4_ = fVar139 + fVar147;
                        auVar81._8_4_ = fVar140 + fVar148;
                        auVar81._12_4_ = fVar141 + fVar149;
                        auVar82._0_4_ = fVar142 + fVar150;
                        auVar82._4_4_ = fVar143 + fVar152;
                        auVar82._8_4_ = fVar144 + fVar153;
                        auVar82._12_4_ = fVar145 + fVar154;
                        auVar83._0_4_ = auVar157._0_4_ * fVar103 + auVar155._0_4_ * fVar92;
                        auVar83._4_4_ = auVar157._4_4_ * fVar107 + auVar155._4_4_ * fVar98;
                        auVar83._8_4_ = auVar157._8_4_ * fVar108 + auVar155._8_4_ * fVar99;
                        auVar83._12_4_ = auVar157._12_4_ * fVar109 + auVar155._12_4_ * fVar100;
                        auVar84._0_4_ =
                             fVar103 * (float)p0.field_0._16_4_ + fVar92 * (float)p1.field_0._16_4_;
                        auVar84._4_4_ =
                             fVar107 * (float)p0.field_0._20_4_ + fVar98 * (float)p1.field_0._20_4_;
                        auVar84._8_4_ =
                             fVar108 * (float)p0.field_0._24_4_ + fVar99 * (float)p1.field_0._24_4_;
                        auVar84._12_4_ =
                             fVar109 * (float)p0.field_0._28_4_ + fVar100 * (float)p1.field_0._28_4_
                        ;
                        auVar85._0_4_ =
                             fVar103 * (float)p0.field_0._32_4_ + fVar92 * (float)p1.field_0._32_4_;
                        auVar85._4_4_ =
                             fVar107 * (float)p0.field_0._36_4_ + fVar98 * (float)p1.field_0._36_4_;
                        auVar85._8_4_ =
                             fVar108 * (float)p0.field_0._40_4_ + fVar99 * (float)p1.field_0._40_4_;
                        auVar85._12_4_ =
                             fVar109 * (float)p0.field_0._44_4_ + fVar100 * (float)p1.field_0._44_4_
                        ;
                      }
                      local_16e8 = *(undefined8 *)(lVar49 + 0x30);
                      uStack_16e0 = *(undefined8 *)(lVar49 + 0x38);
                      auVar67 = vsubps_avx(auVar77,auVar80);
                      auVar134 = ZEXT1664(auVar67);
                      auVar71 = vsubps_avx(auVar78,auVar81);
                      auVar136 = ZEXT1664(auVar71);
                      auVar72 = vsubps_avx(auVar79,auVar82);
                      auVar73 = vsubps_avx(auVar83,auVar77);
                      auVar74 = vsubps_avx(auVar84,auVar78);
                      in_ZMM15 = ZEXT1664(auVar74);
                      auVar86 = vsubps_avx512vl(auVar85,auVar79);
                      auVar70 = vmulps_avx512vl(auVar71,auVar86);
                      auVar19 = vfmsub231ps_fma(auVar70,auVar74,auVar72);
                      auVar101._0_4_ = auVar72._0_4_ * auVar73._0_4_;
                      auVar101._4_4_ = auVar72._4_4_ * auVar73._4_4_;
                      auVar101._8_4_ = auVar72._8_4_ * auVar73._8_4_;
                      auVar101._12_4_ = auVar72._12_4_ * auVar73._12_4_;
                      auVar87 = vfmsub231ps_avx512vl(auVar101,auVar86,auVar67);
                      auVar106._0_4_ = auVar67._0_4_ * auVar74._0_4_;
                      auVar106._4_4_ = auVar67._4_4_ * auVar74._4_4_;
                      auVar106._8_4_ = auVar67._8_4_ * auVar74._8_4_;
                      auVar106._12_4_ = auVar67._12_4_ * auVar74._12_4_;
                      aVar20 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                               vfmsub231ps_fma(auVar106,auVar73,auVar71);
                      auVar11 = vsubps_avx(auVar77,*(undefined1 (*) [16])ray);
                      auVar12 = vsubps_avx(auVar78,*(undefined1 (*) [16])(ray + 0x10));
                      auVar13 = vsubps_avx(auVar79,*(undefined1 (*) [16])(ray + 0x20));
                      auVar70 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar76 = *(undefined1 (*) [16])(ray + 0x50);
                      auVar66 = *(undefined1 (*) [16])(ray + 0x60);
                      auVar88 = vmulps_avx512vl(auVar76,auVar13);
                      auVar88 = vfmsub231ps_fma(auVar88,auVar12,auVar66);
                      auVar151._0_4_ = auVar66._0_4_ * auVar11._0_4_;
                      auVar151._4_4_ = auVar66._4_4_ * auVar11._4_4_;
                      auVar151._8_4_ = auVar66._8_4_ * auVar11._8_4_;
                      auVar151._12_4_ = auVar66._12_4_ * auVar11._12_4_;
                      auVar112 = vfmsub231ps_fma(auVar151,auVar13,auVar70);
                      auVar156._0_4_ = auVar70._0_4_ * auVar12._0_4_;
                      auVar156._4_4_ = auVar70._4_4_ * auVar12._4_4_;
                      auVar156._8_4_ = auVar70._8_4_ * auVar12._8_4_;
                      auVar156._12_4_ = auVar70._12_4_ * auVar12._12_4_;
                      auVar89 = vfmsub231ps_avx512vl(auVar156,auVar11,auVar76);
                      in_ZMM14 = ZEXT1664(auVar89);
                      auVar118._0_4_ = aVar20.v[0] * auVar66._0_4_;
                      auVar118._4_4_ = aVar20.v[1] * auVar66._4_4_;
                      auVar118._8_4_ = aVar20.v[2] * auVar66._8_4_;
                      auVar118._12_4_ = aVar20.v[3] * auVar66._12_4_;
                      auVar76 = vfmadd231ps_avx512vl(auVar118,auVar87,auVar76);
                      auVar70 = vfmadd231ps_fma(auVar76,auVar19,auVar70);
                      auVar66 = vandps_avx512vl(auVar70,auVar161._0_16_);
                      auVar76 = vmulps_avx512vl(auVar86,auVar89);
                      auVar76 = vfmadd231ps_avx512vl(auVar76,auVar112,auVar74);
                      auVar76 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar73);
                      auVar76 = vxorps_avx512vl(auVar66,auVar76);
                      uVar14 = vcmpps_avx512vl(auVar76,auVar69,5);
                      bVar48 = (byte)uVar14 & bVar45;
                      if (bVar48 == 0) {
LAB_01f3f270:
                        bVar48 = 0;
                      }
                      else {
                        auVar138._0_4_ = auVar72._0_4_ * auVar89._0_4_;
                        auVar138._4_4_ = auVar72._4_4_ * auVar89._4_4_;
                        auVar138._8_4_ = auVar72._8_4_ * auVar89._8_4_;
                        auVar138._12_4_ = auVar72._12_4_ * auVar89._12_4_;
                        auVar71 = vfmadd213ps_fma(auVar112,auVar71,auVar138);
                        auVar67 = vfmadd213ps_fma(auVar88,auVar67,auVar71);
                        auVar133._0_4_ = auVar66._0_4_ ^ auVar67._0_4_;
                        auVar133._4_4_ = auVar66._4_4_ ^ auVar67._4_4_;
                        auVar133._8_4_ = auVar66._8_4_ ^ auVar67._8_4_;
                        auVar133._12_4_ = auVar66._12_4_ ^ auVar67._12_4_;
                        auVar134 = ZEXT1664(auVar133);
                        uVar14 = vcmpps_avx512vl(auVar133,auVar69,5);
                        bVar48 = bVar48 & (byte)uVar14;
                        if (bVar48 == 0) goto LAB_01f3f270;
                        auVar41._8_4_ = 0x7fffffff;
                        auVar41._0_8_ = 0x7fffffff7fffffff;
                        auVar41._12_4_ = 0x7fffffff;
                        auVar71 = vandps_avx512vl(auVar70,auVar41);
                        auVar136 = ZEXT1664(auVar71);
                        auVar67 = vsubps_avx(auVar71,auVar76);
                        uVar14 = vcmpps_avx512vl(auVar67,auVar133,5);
                        bVar48 = bVar48 & (byte)uVar14;
                        if (bVar48 == 0) goto LAB_01f3f270;
                        auVar127._0_4_ = aVar20.v[0] * auVar13._0_4_;
                        auVar127._4_4_ = aVar20.v[1] * auVar13._4_4_;
                        auVar127._8_4_ = aVar20.v[2] * auVar13._8_4_;
                        auVar127._12_4_ = aVar20.v[3] * auVar13._12_4_;
                        auVar67 = vfmadd213ps_fma(auVar12,auVar87,auVar127);
                        auVar67 = vfmadd213ps_fma(auVar11,auVar19,auVar67);
                        auVar113._0_4_ = auVar71._0_4_ * *(float *)(ray + 0x30);
                        auVar113._4_4_ = auVar71._4_4_ * *(float *)(ray + 0x34);
                        auVar113._8_4_ = auVar71._8_4_ * *(float *)(ray + 0x38);
                        auVar113._12_4_ = auVar71._12_4_ * *(float *)(ray + 0x3c);
                        auVar110._0_4_ = auVar66._0_4_ ^ auVar67._0_4_;
                        auVar110._4_4_ = auVar66._4_4_ ^ auVar67._4_4_;
                        auVar110._8_4_ = auVar66._8_4_ ^ auVar67._8_4_;
                        auVar110._12_4_ = auVar66._12_4_ ^ auVar67._12_4_;
                        auVar128._0_4_ = auVar71._0_4_ * *(float *)(ray + 0x80);
                        auVar128._4_4_ = auVar71._4_4_ * *(float *)(ray + 0x84);
                        auVar128._8_4_ = auVar71._8_4_ * *(float *)(ray + 0x88);
                        auVar128._12_4_ = auVar71._12_4_ * *(float *)(ray + 0x8c);
                        uVar14 = vcmpps_avx512vl(auVar110,auVar128,2);
                        uVar15 = vcmpps_avx512vl(auVar113,auVar110,1);
                        bVar48 = bVar48 & (byte)uVar14 & (byte)uVar15;
                        if (bVar48 == 0) {
LAB_01f3f911:
                          bVar48 = 0;
                          aVar20 = local_1768;
                          auVar87 = local_1758;
                          auVar19 = local_1748;
                          auVar71 = local_1738;
                          auVar110 = local_1728;
                          auVar76 = _local_1708;
                        }
                        else {
                          uVar14 = vcmpps_avx512vl(auVar70,ZEXT816(0) << 0x20,4);
                          bVar48 = bVar48 & (byte)uVar14;
                          if (bVar48 == 0) goto LAB_01f3f911;
                        }
                        _local_1708 = auVar76;
                        local_1728 = auVar110;
                        local_1738 = auVar71;
                        local_1748 = auVar19;
                        local_1758 = auVar87;
                        local_1768 = aVar20;
                        auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        auVar159 = ZEXT1664(auVar70);
                        auVar70 = vxorps_avx512vl(auVar69,auVar69);
                        auVar160 = ZEXT1664(auVar70);
                        auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar161 = ZEXT1664(auVar70);
                      }
                      auVar70 = auVar160._0_16_;
                      pGVar4 = pRVar3[*(uint *)((long)&local_16e8 + uVar51 * 4)].ptr;
                      uVar52 = pGVar4->mask;
                      auVar96._4_4_ = uVar52;
                      auVar96._0_4_ = uVar52;
                      auVar96._8_4_ = uVar52;
                      auVar96._12_4_ = uVar52;
                      uVar14 = vptestmd_avx512vl(auVar96,*(undefined1 (*) [16])(ray + 0x90));
                      bVar48 = (byte)uVar14 & 0xf & bVar48;
                      if (bVar48 != 0) {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar76 = vrcp14ps_avx512vl(local_1738);
                          auVar68 = vfnmadd213ps_avx512vl(auVar76,local_1738,auVar68);
                          auVar76 = vfmadd132ps_fma(auVar68,auVar76,auVar76);
                          vpbroadcastd_avx512vl();
                          vpbroadcastd_avx512vl();
                          p0.field_0._0_8_ = local_1748._0_8_;
                          p0.field_0._8_8_ = local_1748._8_8_;
                          p0.field_0._16_8_ = local_1758._0_8_;
                          p0.field_0._24_8_ = local_1758._8_8_;
                          p0.field_0.field_0.z.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)local_1768;
                          auVar97 = ZEXT1632(CONCAT412(auVar76._12_4_ * fStack_16fc,
                                                       CONCAT48(auVar76._8_4_ * fStack_1700,
                                                                CONCAT44(auVar76._4_4_ *
                                                                         (float)local_1708._4_4_,
                                                                         auVar76._0_4_ *
                                                                         (float)local_1708._0_4_))))
                          ;
                          vpcmpeqd_avx2(auVar97,auVar97);
                          iVar46 = *(int *)(ray + 0x80);
                          iVar42 = *(int *)(ray + 0x84);
                          iVar43 = *(int *)(ray + 0x88);
                          iVar44 = *(int *)(ray + 0x8c);
                          auVar76 = vmulps_avx512vl(auVar76,local_1728);
                          bVar62 = (bool)(bVar48 >> 1 & 1);
                          bVar7 = (bool)(bVar48 >> 2 & 1);
                          *(uint *)(ray + 0x80) =
                               (uint)(bVar48 & 1) * auVar76._0_4_ |
                               (uint)!(bool)(bVar48 & 1) * iVar46;
                          *(uint *)(ray + 0x84) =
                               (uint)bVar62 * auVar76._4_4_ | (uint)!bVar62 * iVar42;
                          *(uint *)(ray + 0x88) =
                               (uint)bVar7 * auVar76._8_4_ | (uint)!bVar7 * iVar43;
                          *(uint *)(ray + 0x8c) =
                               (uint)(bVar48 >> 3) * auVar76._12_4_ |
                               (uint)!(bool)(bVar48 >> 3) * iVar44;
                          itime.field_0 =
                               (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                               vpmovm2d_avx512vl((ulong)bVar48);
                          p1.field_0._0_8_ = &itime;
                          p1.field_0._8_8_ = pGVar4->userPtr;
                          p1.field_0._16_8_ = context->user;
                          p1.field_0._24_8_ = ray;
                          p1.field_0._32_8_ = &p0;
                          p1.field_0._40_4_ = 4;
                          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar134 = ZEXT1664(auVar134._0_16_);
                            auVar136 = ZEXT1664(auVar136._0_16_);
                            in_ZMM14 = ZEXT1664(auVar89);
                            in_ZMM15 = ZEXT1664(auVar74);
                            (*pGVar4->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                            auVar76 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar161 = ZEXT1664(auVar76);
                            auVar70 = vxorps_avx512vl(auVar70,auVar70);
                            auVar160 = ZEXT1664(auVar70);
                            auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                            auVar159 = ZEXT1664(auVar70);
                            auVar70 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar158 = ZEXT1664(auVar70);
                          }
                          auVar70 = auVar160._0_16_;
                          uVar65 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                     (undefined1  [16])itime.field_0);
                          if ((uVar65 & 0xf) == 0) {
                            uVar65 = 0;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar134 = ZEXT1664(auVar134._0_16_);
                              auVar136 = ZEXT1664(auVar136._0_16_);
                              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                              (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                              auVar76 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar161 = ZEXT1664(auVar76);
                              auVar70 = vxorps_avx512vl(auVar70,auVar70);
                              auVar160 = ZEXT1664(auVar70);
                              auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                              auVar159 = ZEXT1664(auVar70);
                              auVar70 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar158 = ZEXT1664(auVar70);
                            }
                            uVar65 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                       (undefined1  [16])itime.field_0);
                            uVar65 = uVar65 & 0xf;
                            auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            bVar62 = (bool)((byte)uVar65 & 1);
                            auVar90._0_4_ =
                                 (uint)bVar62 * auVar70._0_4_ |
                                 (uint)!bVar62 * *(int *)(p1.field_0._24_8_ + 0x80);
                            bVar62 = (bool)((byte)(uVar65 >> 1) & 1);
                            auVar90._4_4_ =
                                 (uint)bVar62 * auVar70._4_4_ |
                                 (uint)!bVar62 * *(int *)(p1.field_0._24_8_ + 0x84);
                            bVar62 = (bool)((byte)(uVar65 >> 2) & 1);
                            auVar90._8_4_ =
                                 (uint)bVar62 * auVar70._8_4_ |
                                 (uint)!bVar62 * *(int *)(p1.field_0._24_8_ + 0x88);
                            bVar62 = SUB81(uVar65 >> 3,0);
                            auVar90._12_4_ =
                                 (uint)bVar62 * auVar70._12_4_ |
                                 (uint)!bVar62 * *(int *)(p1.field_0._24_8_ + 0x8c);
                            *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar90;
                          }
                          bVar48 = (byte)uVar65;
                          auVar91._0_4_ =
                               (uint)(bVar48 & 1) * *(int *)pRVar1 |
                               (uint)!(bool)(bVar48 & 1) * iVar46;
                          bVar62 = (bool)((byte)(uVar65 >> 1) & 1);
                          auVar91._4_4_ =
                               (uint)bVar62 * *(int *)(ray + 0x84) | (uint)!bVar62 * iVar42;
                          bVar62 = (bool)((byte)(uVar65 >> 2) & 1);
                          auVar91._8_4_ =
                               (uint)bVar62 * *(int *)(ray + 0x88) | (uint)!bVar62 * iVar43;
                          bVar62 = SUB81(uVar65 >> 3,0);
                          auVar91._12_4_ =
                               (uint)bVar62 * *(int *)(ray + 0x8c) | (uint)!bVar62 * iVar44;
                          *(undefined1 (*) [16])pRVar1 = auVar91;
                        }
                        bVar45 = (bVar48 ^ 0xf) & bVar45;
                      }
                      uVar65 = (ulong)bVar45;
                      if ((bVar45 == 0) || (bVar62 = 2 < uVar51, uVar51 = uVar51 + 1, bVar62))
                      break;
                    }
                    bVar55 = bVar55 & bVar45;
                    uVar56 = (ulong)bVar55;
                  } while ((bVar55 != 0) && (uVar47 = uVar47 + 1, uVar47 < uVar64 - 8));
                  bVar55 = bVar55 ^ 0xf;
                }
                bVar55 = bVar55 | (byte)local_19d8;
                local_19d8 = (uint)bVar55;
                if (bVar55 == 0xf) {
                  local_19d8._0_1_ = 0xf;
                  goto LAB_01f3f973;
                }
                auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                tray.tfar.field_0.i[0] =
                     (uint)(bVar55 & 1) * auVar70._0_4_ |
                     (uint)!(bool)(bVar55 & 1) * tray.tfar.field_0.i[0];
                bVar62 = (bool)(bVar55 >> 1 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar62 * auVar70._4_4_ | (uint)!bVar62 * tray.tfar.field_0.i[1];
                bVar62 = (bool)(bVar55 >> 2 & 1);
                tray.tfar.field_0.i[2] =
                     (uint)bVar62 * auVar70._8_4_ | (uint)!bVar62 * tray.tfar.field_0.i[2];
                bVar62 = (bool)(bVar55 >> 3 & 1);
                tray.tfar.field_0.i[3] =
                     (uint)bVar62 * auVar70._12_4_ | (uint)!bVar62 * tray.tfar.field_0.i[3];
              }
              goto LAB_01f3ec6a;
            }
            uVar14 = vcmpps_avx512vl(auVar102._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar64 = root.ptr & 0xfffffffffffffff0;
            lVar49 = -0x10;
            sVar53 = 8;
            auVar70 = auVar159._0_16_;
            do {
              root.ptr = *(size_t *)(uVar64 + 0x20 + lVar49 * 2);
              if (root.ptr == 8) {
                auVar102 = ZEXT1664(auVar70);
                root.ptr = sVar53;
                break;
              }
              uVar59 = *(undefined4 *)(uVar64 + 0x90 + lVar49);
              auVar88._4_4_ = uVar59;
              auVar88._0_4_ = uVar59;
              auVar88._8_4_ = uVar59;
              auVar88._12_4_ = uVar59;
              auVar76 = *(undefined1 (*) [16])(ray + 0x70);
              uVar59 = *(undefined4 *)(uVar64 + 0x30 + lVar49);
              auVar71._4_4_ = uVar59;
              auVar71._0_4_ = uVar59;
              auVar71._8_4_ = uVar59;
              auVar71._12_4_ = uVar59;
              auVar68 = vfmadd213ps_avx512vl(auVar88,auVar76,auVar71);
              uVar59 = *(undefined4 *)(uVar64 + 0xb0 + lVar49);
              auVar112._4_4_ = uVar59;
              auVar112._0_4_ = uVar59;
              auVar112._8_4_ = uVar59;
              auVar112._12_4_ = uVar59;
              uVar59 = *(undefined4 *)(uVar64 + 0x50 + lVar49);
              auVar72._4_4_ = uVar59;
              auVar72._0_4_ = uVar59;
              auVar72._8_4_ = uVar59;
              auVar72._12_4_ = uVar59;
              auVar69 = vfmadd213ps_avx512vl(auVar112,auVar76,auVar72);
              uVar59 = *(undefined4 *)(uVar64 + 0xd0 + lVar49);
              auVar87._4_4_ = uVar59;
              auVar87._0_4_ = uVar59;
              auVar87._8_4_ = uVar59;
              auVar87._12_4_ = uVar59;
              uVar59 = *(undefined4 *)(uVar64 + 0x70 + lVar49);
              auVar73._4_4_ = uVar59;
              auVar73._0_4_ = uVar59;
              auVar73._8_4_ = uVar59;
              auVar73._12_4_ = uVar59;
              auVar71 = vfmadd213ps_avx512vl(auVar87,auVar76,auVar73);
              uVar59 = *(undefined4 *)(uVar64 + 0xa0 + lVar49);
              auVar86._4_4_ = uVar59;
              auVar86._0_4_ = uVar59;
              auVar86._8_4_ = uVar59;
              auVar86._12_4_ = uVar59;
              uVar59 = *(undefined4 *)(uVar64 + 0x40 + lVar49);
              auVar74._4_4_ = uVar59;
              auVar74._0_4_ = uVar59;
              auVar74._8_4_ = uVar59;
              auVar74._12_4_ = uVar59;
              auVar72 = vfmadd213ps_avx512vl(auVar86,auVar76,auVar74);
              uVar59 = *(undefined4 *)(uVar64 + 0xc0 + lVar49);
              auVar89._4_4_ = uVar59;
              auVar89._0_4_ = uVar59;
              auVar89._8_4_ = uVar59;
              auVar89._12_4_ = uVar59;
              uVar59 = *(undefined4 *)(uVar64 + 0x60 + lVar49);
              auVar11._4_4_ = uVar59;
              auVar11._0_4_ = uVar59;
              auVar11._8_4_ = uVar59;
              auVar11._12_4_ = uVar59;
              auVar73 = vfmadd213ps_avx512vl(auVar89,auVar76,auVar11);
              uVar59 = *(undefined4 *)(uVar64 + 0xe0 + lVar49);
              auVar132._4_4_ = uVar59;
              auVar132._0_4_ = uVar59;
              auVar132._8_4_ = uVar59;
              auVar132._12_4_ = uVar59;
              uVar59 = *(undefined4 *)(uVar64 + 0x80 + lVar49);
              auVar12._4_4_ = uVar59;
              auVar12._0_4_ = uVar59;
              auVar12._8_4_ = uVar59;
              auVar12._12_4_ = uVar59;
              auVar74 = vfmadd213ps_avx512vl(auVar132,auVar76,auVar12);
              auVar13._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar13._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar13._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar13._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar19._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar19._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar19._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar19._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar66 = vfmsub213ps_fma(auVar68,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar13);
              auVar67 = vfmsub213ps_fma(auVar69,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar19);
              auVar71 = vfmsub213ps_fma(auVar71,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,
                                        (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0);
              auVar72 = vfmsub213ps_fma(auVar72,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar13);
              auVar73 = vfmsub213ps_fma(auVar73,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar19);
              auVar74 = vfmsub213ps_fma(auVar74,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,
                                        (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0);
              auVar134 = ZEXT1664(auVar74);
              auVar68 = vpminsd_avx(auVar66,auVar72);
              auVar69 = vpminsd_avx(auVar67,auVar73);
              auVar68 = vpmaxsd_avx(auVar68,auVar69);
              auVar69 = vpminsd_avx(auVar71,auVar74);
              auVar136 = ZEXT1664(auVar69);
              auVar68 = vpmaxsd_avx(auVar68,auVar69);
              auVar69 = vpmaxsd_avx(auVar66,auVar72);
              auVar66 = vpmaxsd_avx(auVar67,auVar73);
              auVar66 = vpminsd_avx(auVar69,auVar66);
              auVar69 = vpmaxsd_avx(auVar71,auVar74);
              auVar66 = vpminsd_avx(auVar66,auVar69);
              auVar69 = vpmaxsd_avx(auVar68,(undefined1  [16])tray.tnear.field_0);
              auVar66 = vpminsd_avx(auVar66,(undefined1  [16])tray.tfar.field_0);
              uVar15 = vcmpps_avx512vl(auVar69,auVar66,2);
              bVar55 = (byte)uVar15;
              if ((uVar52 & 7) == 6) {
                uVar59 = *(undefined4 *)(uVar64 + 0x100 + lVar49);
                auVar21._4_4_ = uVar59;
                auVar21._0_4_ = uVar59;
                auVar21._8_4_ = uVar59;
                auVar21._12_4_ = uVar59;
                uVar15 = vcmpps_avx512vl(auVar76,auVar21,1);
                uVar59 = *(undefined4 *)(uVar64 + 0xf0 + lVar49);
                auVar22._4_4_ = uVar59;
                auVar22._0_4_ = uVar59;
                auVar22._8_4_ = uVar59;
                auVar22._12_4_ = uVar59;
                uVar16 = vcmpps_avx512vl(auVar76,auVar22,0xd);
                bVar55 = (byte)uVar15 & (byte)uVar16 & bVar55;
              }
              bVar55 = bVar55 & (byte)uVar14;
              if (bVar55 == 0) {
                auVar102 = ZEXT1664(auVar70);
                root.ptr = sVar53;
              }
              else {
                auVar68 = vblendmps_avx512vl(auVar159._0_16_,auVar68);
                bVar62 = (bool)(bVar55 >> 1 & 1);
                bVar7 = (bool)(bVar55 >> 2 & 1);
                bVar8 = (bool)(bVar55 >> 3 & 1);
                auVar102 = ZEXT1664(CONCAT412((uint)bVar8 * auVar68._12_4_ |
                                              (uint)!bVar8 * auVar76._12_4_,
                                              CONCAT48((uint)bVar7 * auVar68._8_4_ |
                                                       (uint)!bVar7 * auVar76._8_4_,
                                                       CONCAT44((uint)bVar62 * auVar68._4_4_ |
                                                                (uint)!bVar62 * auVar76._4_4_,
                                                                (uint)(bVar55 & 1) * auVar68._0_4_ |
                                                                (uint)!(bool)(bVar55 & 1) *
                                                                auVar76._0_4_))));
                if (sVar53 != 8) {
                  pNVar60->ptr = sVar53;
                  pNVar60 = pNVar60 + 1;
                  *(undefined1 (*) [16])paVar61->v = auVar70;
                  paVar61 = paVar61 + 1;
                }
              }
              auVar70 = auVar102._0_16_;
              lVar49 = lVar49 + 4;
              sVar53 = root.ptr;
            } while (lVar49 != 0);
            iVar46 = 4;
            if (root.ptr == 8) goto LAB_01f3ee9c;
            uVar14 = vcmpps_avx512vl((undefined1  [16])auVar102._0_16_,
                                     (undefined1  [16])tray.tfar.field_0,9);
          } while ((byte)uVar58 < (byte)POPCOUNT((int)uVar14));
          pNVar60->ptr = root.ptr;
          pNVar60 = pNVar60 + 1;
          *paVar61 = auVar102._0_16_;
          paVar61 = paVar61 + 1;
        }
        else {
          do {
            sVar53 = 0;
            for (uVar47 = uVar64; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
              sVar53 = sVar53 + 1;
            }
            auVar134 = ZEXT1664(auVar134._0_16_);
            auVar136 = ZEXT1664(auVar136._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar62 = occluded1(This,bvh,root,sVar53,&pre,ray,&tray,context);
            bVar55 = (byte)(1 << ((uint)sVar53 & 0x1f));
            if (!bVar62) {
              bVar55 = 0;
            }
            bVar55 = (byte)local_19d8 | bVar55;
            local_19d8 = (uint)bVar55;
            uVar64 = uVar64 - 1 & uVar64;
          } while (uVar64 != 0);
          iVar46 = 3;
          if (bVar55 != 0xf) {
            auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar55 & 1) * auVar70._0_4_ |
                 (uint)!(bool)(bVar55 & 1) * tray.tfar.field_0.i[0];
            bVar62 = (bool)(bVar55 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar62 * auVar70._4_4_ | (uint)!bVar62 * tray.tfar.field_0.i[1];
            bVar62 = (bool)(bVar55 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar62 * auVar70._8_4_ | (uint)!bVar62 * tray.tfar.field_0.i[2];
            bVar62 = (bool)(bVar55 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar62 * auVar70._12_4_ | (uint)!bVar62 * tray.tfar.field_0.i[3];
            iVar46 = 2;
          }
          auVar70 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar158 = ZEXT1664(auVar70);
          auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar159 = ZEXT1664(auVar70);
          auVar70 = vxorps_avx512vl(auVar160._0_16_,auVar160._0_16_);
          auVar160 = ZEXT1664(auVar70);
          auVar70 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar161 = ZEXT1664(auVar70);
          auVar102 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if (uVar58 < (uint)POPCOUNT(uVar59)) goto LAB_01f3ecac;
        }
LAB_01f3ee9c:
      } while ((iVar46 == 4) || (iVar46 == 2));
LAB_01f3f973:
      local_19d8._0_1_ = (byte)local_19d8 & bVar63;
      bVar62 = (bool)((byte)local_19d8 >> 1 & 1);
      bVar7 = (bool)((byte)local_19d8 >> 2 & 1);
      *(uint *)pRVar1 =
           (uint)((byte)local_19d8 & 1) * -0x800000 |
           (uint)!(bool)((byte)local_19d8 & 1) * *(int *)pRVar1;
      *(uint *)(ray + 0x84) = (uint)bVar62 * -0x800000 | (uint)!bVar62 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)((byte)local_19d8 >> 3) * -0x800000 |
           (uint)!(bool)((byte)local_19d8 >> 3) * *(int *)(ray + 0x8c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }